

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O0

void load_vector_vector<QPDF::HPageOffsetEntry>
               (BitStream *bit_stream,int nitems1,
               vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> *vec1,
               offset_in_HPageOffsetEntry_to_int nitems2,int bits_wanted,
               offset_in_HPageOffsetEntry_to_vector<int,_std::allocator<int>_> vec2)

{
  int iVar1;
  ulong uVar2;
  BitStream *this;
  size_t sVar3;
  reference pvVar4;
  vector<int,_std::allocator<int>_> *this_00;
  int local_48;
  int local_44;
  ulong uStack_40;
  int i2;
  size_t i1;
  offset_in_HPageOffsetEntry_to_vector<int,_std::allocator<int>_> vec2_local;
  offset_in_HPageOffsetEntry_to_int oStack_28;
  int bits_wanted_local;
  offset_in_HPageOffsetEntry_to_int nitems2_local;
  vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> *vec1_local;
  BitStream *pBStack_10;
  int nitems1_local;
  BitStream *bit_stream_local;
  
  uStack_40 = 0;
  i1 = vec2;
  vec2_local._4_4_ = bits_wanted;
  oStack_28 = nitems2;
  nitems2_local = (offset_in_HPageOffsetEntry_to_int)vec1;
  vec1_local._4_4_ = nitems1;
  pBStack_10 = bit_stream;
  while( true ) {
    uVar2 = uStack_40;
    sVar3 = QIntC::to_size<int>((int *)((long)&vec1_local + 4));
    if (sVar3 <= uVar2) break;
    local_44 = 0;
    while( true ) {
      iVar1 = local_44;
      pvVar4 = std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::at
                         ((vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> *
                          )nitems2_local,uStack_40);
      if (*(int *)((long)&pvVar4->delta_nobjects + oStack_28) <= iVar1) break;
      pvVar4 = std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::at
                         ((vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> *
                          )nitems2_local,uStack_40);
      this = pBStack_10;
      this_00 = (vector<int,_std::allocator<int>_> *)((long)&pvVar4->delta_nobjects + i1);
      sVar3 = QIntC::to_size<int>((int *)((long)&vec2_local + 4));
      local_48 = BitStream::getBitsInt(this,sVar3);
      std::vector<int,_std::allocator<int>_>::push_back(this_00,&local_48);
      local_44 = local_44 + 1;
    }
    uStack_40 = uStack_40 + 1;
  }
  BitStream::skipToNextByte(pBStack_10);
  return;
}

Assistant:

static void
load_vector_vector(
    BitStream& bit_stream,
    int nitems1,
    std::vector<T>& vec1,
    int T::* nitems2,
    int bits_wanted,
    std::vector<int> T::* vec2)
{
    // nitems1 times, read nitems2 (from the ith element of vec1) items into the vec2 vector field
    // of the ith item of vec1.
    for (size_t i1 = 0; i1 < QIntC::to_size(nitems1); ++i1) {
        for (int i2 = 0; i2 < vec1.at(i1).*nitems2; ++i2) {
            (vec1.at(i1).*vec2).push_back(bit_stream.getBitsInt(QIntC::to_size(bits_wanted)));
        }
    }
    bit_stream.skipToNextByte();
}